

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test1<nrg::AsyncExecutor<nrg::PrioExecution>>(char *title)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  rep rVar7;
  int local_294;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_200;
  allocator<char> local_1f1;
  string local_1f0;
  TimedCaller local_1d0;
  int local_1a4;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_1a0;
  int local_194;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_190;
  int local_184;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_180;
  int local_174;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_170;
  int local_164;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_160;
  int local_154;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_150;
  duration<long,_std::ratio<1L,_1000000000L>_> local_148;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_140;
  duration<long,_std::ratio<1L,_1000000000L>_> local_138;
  type dur;
  duration<long,_std::ratio<1L,_1000L>_> local_128;
  undefined1 local_120 [8];
  AsyncResult<int> ar4;
  time_point t1;
  duration<long,std::ratio<1l,1000l>> local_100 [12];
  undefined1 local_f4 [8];
  optional<int> res3;
  int res2;
  int res1;
  AsyncResult<int> ar3;
  AsyncResult<int> ar2;
  AsyncResult<int> ar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_58;
  int local_50 [2];
  int i;
  ExceptionHandler local_40;
  undefined1 local_20 [8];
  Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> ex;
  char *title_local;
  
  ex.executor_.impl_.
  super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)title;
  std::function<void(std::exception_const&)>::function<void(&)(std::exception_const&),void>
            ((function<void(std::exception_const&)> *)&local_40,onError);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>_>::Executor
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> *)local_20,&local_40);
  std::function<void_(const_std::exception_&)>::~function(&local_40);
  local_50[0] = 0x2a;
  local_58 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  _Var1 = ex.executor_.impl_.
          super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98," -> start",
             (allocator<char> *)
             ((long)&ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::operator+(&local_78,(char *)_Var1._M_pi,&local_98);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,
             print<std::__cxx11::string>,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo1");
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo2");
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo3");
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo4");
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo5");
  local_50[0] = local_50[0] + 1;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print2,local_50,
             (char (*) [7])"hallo6");
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,exception);
  nrg::AsyncResult<int>::AsyncResult
            ((AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::AsyncResult
            ((AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::AsyncResult((AsyncResult<int> *)&res1);
  res2 = 0x2a;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,withResult,
             (AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(AsyncResult<int> *)&res1,&res2);
  iVar3 = nrg::AsyncResult<int>::getResult
                    ((AsyncResult<int> *)
                     &ar2.impl_.
                      super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  res3.super__Optional_base<int,_false>.field_0._M_payload = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)
             &res3.super__Optional_base<int,_false>._M_engaged,(int *)&res3);
  iVar4 = nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
                    ((AsyncResult<int> *)
                     &ar3.impl_.
                      super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (duration<long,_std::ratio<1L,_1000L>_> *)
                     &res3.super__Optional_base<int,_false>._M_engaged,0x2b);
  t1.__d.__r._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_100,(int *)((long)&t1.__d.__r + 4));
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            ((AsyncResult<int> *)local_f4,(duration<long,_std::ratio<1L,_1000L>_> *)&res1);
  poVar5 = std::operator<<((ostream *)&std::cerr,"ar1: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = std::operator<<(poVar5,",  ar2: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(poVar5,",  res3: ");
  bVar2 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool((optional *)local_f4);
  if (bVar2) {
    piVar6 = std::experimental::fundamentals_v1::optional<int>::operator*((optional<int> *)local_f4)
    ;
    local_294 = *piVar6;
  }
  else {
    local_294 = 0;
  }
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_294);
  std::operator<<(poVar5,"\n");
  ar4.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)now();
  nrg::AsyncResult<int>::AsyncResult((AsyncResult<int> *)local_120);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,roundTrip,
             (AsyncResult<int> *)local_120);
  dur.__r._4_4_ = 200;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_128,(int *)((long)&dur.__r + 4));
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            ((AsyncResult<int> *)local_120,&local_128,99);
  local_140.__d.__r = (duration)now();
  local_138.__r =
       (rep)std::chrono::operator-
                      (&local_140,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&ar4.impl_.
                           super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
  poVar5 = std::operator<<((ostream *)&std::cout,"ar4 duration: ");
  local_148.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_138);
  rVar7 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_148);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar7);
  std::operator<<(poVar5," ns\n");
  local_150 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_154 = 0xfb;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_150,
             &local_154);
  local_160 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_164 = 0xfc;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_160,
             &local_164);
  local_170 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_174 = 0xfd;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_170,
             &local_174);
  local_180 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_184 = 0xfe;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_180,
             &local_184);
  local_190 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_194 = 0xff;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_190,
             &local_194);
  local_1a0 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_1a4 = 0x100;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,print<int>,&local_1a0,
             &local_1a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"no timeout",&local_1f1);
  TimedCaller::TimedCaller(&local_1d0,&local_1f0);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,&local_1d0);
  TimedCaller::~TimedCaller(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  local_200 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  _Var1 = ex.executor_.impl_.
          super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240," -> done\n",&local_241);
  std::operator+(&local_220,(char *)_Var1._M_pi,&local_240);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>> *)local_20,
             print<std::__cxx11::string>,&local_200,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  nrg::AsyncResult<int>::~AsyncResult((AsyncResult<int> *)local_120);
  nrg::AsyncResult<int>::~AsyncResult((AsyncResult<int> *)&res1);
  nrg::AsyncResult<int>::~AsyncResult
            ((AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::~AsyncResult
            ((AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>_>::~Executor
            ((Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> *)local_20);
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}